

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roadmap.cpp
# Opt level: O2

bool reachedGoal(RVOSimulator *sim)

{
  ulong uVar1;
  ulong agentNo;
  size_t sVar2;
  Vector2 *pVVar3;
  float fVar4;
  float fVar5;
  
  uVar1 = 0;
  do {
    agentNo = uVar1;
    sVar2 = RVO::RVOSimulator::getNumAgents(sim);
    if (sVar2 <= agentNo) break;
    pVVar3 = RVO::RVOSimulator::getAgentPosition(sim,agentNo);
    fVar4 = pVVar3->x_ -
            roadmap.super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>._M_impl.
            super__Vector_impl_data._M_start
            [goals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[agentNo]].position.x_;
    fVar5 = pVVar3->y_ -
            roadmap.super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>._M_impl.
            super__Vector_impl_data._M_start
            [goals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[agentNo]].position.y_;
    uVar1 = agentNo + 1;
  } while (fVar4 * fVar4 + fVar5 * fVar5 <= 400.0);
  return sVar2 <= agentNo;
}

Assistant:

bool reachedGoal(RVO::RVOSimulator *sim)
{
	/* Check if all agents have reached their goals. */
	for (size_t i = 0; i < sim->getNumAgents(); ++i) {
		if (RVO::absSq(sim->getAgentPosition(i) - roadmap[goals[i]].position) > 20.0f * 20.0f) {
			return false;
		}
	}

	return true;
}